

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

FT_Error tt_face_load_name(TT_Face face,FT_Stream stream)

{
  FT_UInt16 FVar1;
  TT_NameTableRec *structure;
  FT_Byte *pFVar2;
  TT_NameRec *pTVar3;
  TT_LangTagRec *local_88;
  uint local_80;
  FT_UInt local_7c;
  FT_UInt valid;
  FT_UInt count;
  TT_Name entry_1;
  TT_LangTag limit;
  TT_LangTag entry;
  TT_LangTag langTags;
  TT_Name names;
  TT_NameTable table;
  FT_ULong storage_limit;
  FT_ULong storage_start;
  FT_ULong table_len;
  FT_ULong table_pos;
  FT_Memory memory;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  table_pos = (FT_ULong)stream->memory;
  langTags = (TT_LangTag)0x0;
  entry = (TT_LangTag)0x0;
  structure = &face->name_table;
  (face->name_table).stream = stream;
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  memory._4_4_ = (*face->goto_table)(face,0x6e616d65,stream,&storage_start);
  if (memory._4_4_ == 0) {
    table_len = FT_Stream_Pos(pFStack_18);
    memory._4_4_ = FT_Stream_ReadFields(pFStack_18,tt_face_load_name::name_table_fields,structure);
    if (memory._4_4_ == 0) {
      storage_limit = table_len + 6 + (ulong)((face->name_table).numNameRecords * 0xc);
      pFVar2 = (FT_Byte *)(table_len + storage_start);
      if (pFVar2 < storage_limit) {
        memory._4_4_ = 0x91;
      }
      else {
        if (structure->format == 1) {
          memory._4_4_ = FT_Stream_Seek(pFStack_18,storage_limit);
          if (memory._4_4_ != 0) goto LAB_0032cbc5;
          FVar1 = FT_Stream_ReadUShort(pFStack_18,(FT_Error *)((long)&memory + 4));
          (face->name_table).numLangTagRecords = (uint)FVar1;
          if (memory._4_4_ != 0) goto LAB_0032cbc5;
          storage_limit = storage_limit + ((face->name_table).numLangTagRecords * 4 + 2);
          entry = (TT_LangTag)
                  ft_mem_qrealloc((FT_Memory)table_pos,0x18,0,
                                  (ulong)(face->name_table).numLangTagRecords,(void *)0x0,
                                  (FT_Error *)((long)&memory + 4));
          if ((memory._4_4_ != 0) ||
             (memory._4_4_ = FT_Stream_EnterFrame
                                       (pFStack_18,
                                        (ulong)((face->name_table).numLangTagRecords << 2)),
             memory._4_4_ != 0)) goto LAB_0032cbc5;
          if (entry == (TT_LangTagRec *)0x0) {
            local_88 = (TT_LangTagRec *)0x0;
          }
          else {
            local_88 = entry + (face->name_table).numLangTagRecords;
          }
          memory._4_4_ = 0;
          for (limit = entry; limit < local_88; limit = limit + 1) {
            memory._4_4_ = FT_Stream_ReadFields
                                     (pFStack_18,tt_face_load_name::langTag_record_fields,limit);
            limit->stringOffset = table_len + (face->name_table).storageOffset + limit->stringOffset
            ;
            if (((FT_Byte *)limit->stringOffset < storage_limit) ||
               (pFVar2 < (FT_Byte *)(limit->stringOffset + (ulong)limit->stringLength))) {
              limit->stringLength = 0;
            }
            limit->string = (FT_Byte *)0x0;
          }
          (face->name_table).langTags = entry;
          FT_Stream_ExitFrame(pFStack_18);
          memory._4_4_ = FT_Stream_Seek(pFStack_18,table_len + 6);
        }
        entry = (TT_LangTag)0x0;
        langTags = (TT_LangTag)
                   ft_mem_qrealloc((FT_Memory)table_pos,0x20,0,
                                   (ulong)(face->name_table).numNameRecords,(void *)0x0,
                                   (FT_Error *)((long)&memory + 4));
        if ((memory._4_4_ == 0) &&
           (memory._4_4_ = FT_Stream_EnterFrame
                                     (pFStack_18,(ulong)((face->name_table).numNameRecords * 0xc)),
           memory._4_4_ == 0)) {
          local_7c = (face->name_table).numNameRecords;
          local_80 = 0;
          _valid = langTags;
          for (; local_7c != 0; local_7c = local_7c - 1) {
            memory._4_4_ = FT_Stream_ReadFields
                                     (pFStack_18,tt_face_load_name::name_record_fields,_valid);
            if ((((memory._4_4_ == 0) && ((short)_valid->stringOffset != 0)) &&
                (_valid->string = _valid->string + table_len + (face->name_table).storageOffset,
                storage_limit <= _valid->string)) &&
               ((_valid->string + (ushort)_valid->stringOffset <= pFVar2 &&
                (((structure->format != 1 || (*(ushort *)&_valid->field_0x4 < 0x8000)) ||
                 ((*(ushort *)&_valid->field_0x4 - 0x8000 < (face->name_table).numLangTagRecords &&
                  ((face->name_table).langTags[*(ushort *)&_valid->field_0x4 - 0x8000].stringLength
                   != 0)))))))) {
              *(undefined8 *)(_valid + 1) = 0;
              local_80 = local_80 + 1;
              _valid = (TT_LangTag)&_valid[1].stringOffset;
            }
          }
          pTVar3 = (TT_NameRec *)
                   ft_mem_qrealloc((FT_Memory)table_pos,0x20,
                                   (ulong)(face->name_table).numNameRecords,(ulong)local_80,langTags
                                   ,(FT_Error *)((long)&memory + 4));
          (face->name_table).names = pTVar3;
          langTags = (TT_LangTag)0x0;
          (face->name_table).numNameRecords = local_80;
          FT_Stream_ExitFrame(pFStack_18);
          *(short *)&stream_local[7].base = (short)(face->name_table).numNameRecords;
        }
      }
    }
  }
LAB_0032cbc5:
  ft_mem_free((FT_Memory)table_pos,langTags);
  ft_mem_free((FT_Memory)table_pos,entry);
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_name( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error      error;
    FT_Memory     memory = stream->memory;
    FT_ULong      table_pos, table_len;
    FT_ULong      storage_start, storage_limit;
    TT_NameTable  table;
    TT_Name       names    = NULL;
    TT_LangTag    langTags = NULL;

    static const FT_Frame_Field  name_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameTableRec

      FT_FRAME_START( 6 ),
        FT_FRAME_USHORT( format ),
        FT_FRAME_USHORT( numNameRecords ),
        FT_FRAME_USHORT( storageOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  name_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( platformID ),
        FT_FRAME_USHORT( encodingID ),
        FT_FRAME_USHORT( languageID ),
        FT_FRAME_USHORT( nameID ),
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  langTag_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_LangTagRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };


    table         = &face->name_table;
    table->stream = stream;

    error = face->goto_table( face, TTAG_name, stream, &table_len );
    if ( error )
      goto Exit;

    table_pos = FT_STREAM_POS();

    if ( FT_STREAM_READ_FIELDS( name_table_fields, table ) )
      goto Exit;

    /* Some popular Asian fonts have an invalid `storageOffset' value (it */
    /* should be at least `6 + 12*numNameRecords').  However, the string  */
    /* offsets, computed as `storageOffset + entry->stringOffset', are    */
    /* valid pointers within the name table...                            */
    /*                                                                    */
    /* We thus can't check `storageOffset' right now.                     */
    /*                                                                    */
    storage_start = table_pos + 6 + 12 * table->numNameRecords;
    storage_limit = table_pos + table_len;

    if ( storage_start > storage_limit )
    {
      FT_ERROR(( "tt_face_load_name: invalid `name' table\n" ));
      error = FT_THROW( Name_Table_Missing );
      goto Exit;
    }

    /* `name' format 1 contains additional language tag records, */
    /* which we load first                                       */
    if ( table->format == 1 )
    {
      if ( FT_STREAM_SEEK( storage_start )            ||
           FT_READ_USHORT( table->numLangTagRecords ) )
        goto Exit;

      storage_start += 2 + 4 * table->numLangTagRecords;

      /* allocate language tag records array */
      if ( FT_QNEW_ARRAY( langTags, table->numLangTagRecords ) ||
           FT_FRAME_ENTER( table->numLangTagRecords * 4 )      )
        goto Exit;

      /* load language tags */
      {
        TT_LangTag  entry = langTags;
        TT_LangTag  limit = FT_OFFSET( entry, table->numLangTagRecords );


        for ( ; entry < limit; entry++ )
        {
          (void)FT_STREAM_READ_FIELDS( langTag_record_fields, entry );

          /* check that the langTag string is within the table */
          entry->stringOffset += table_pos + table->storageOffset;
          if ( entry->stringOffset                       < storage_start ||
               entry->stringOffset + entry->stringLength > storage_limit )
          {
            /* invalid entry; ignore it */
            entry->stringLength = 0;
          }

          /* mark the string as not yet loaded */
          entry->string = NULL;
        }

        table->langTags = langTags;
        langTags        = NULL;
      }

      FT_FRAME_EXIT();

      (void)FT_STREAM_SEEK( table_pos + 6 );
    }

    /* allocate name records array */
    if ( FT_QNEW_ARRAY( names, table->numNameRecords ) ||
         FT_FRAME_ENTER( table->numNameRecords * 12 )  )
      goto Exit;

    /* load name records */
    {
      TT_Name  entry = names;
      FT_UInt  count = table->numNameRecords;
      FT_UInt  valid = 0;


      for ( ; count > 0; count-- )
      {
        if ( FT_STREAM_READ_FIELDS( name_record_fields, entry ) )
          continue;

        /* check that the name is not empty */
        if ( entry->stringLength == 0 )
          continue;

        /* check that the name string is within the table */
        entry->stringOffset += table_pos + table->storageOffset;
        if ( entry->stringOffset                       < storage_start ||
             entry->stringOffset + entry->stringLength > storage_limit )
        {
          /* invalid entry; ignore it */
          continue;
        }

        /* assure that we have a valid language tag ID, and   */
        /* that the corresponding langTag entry is valid, too */
        if ( table->format == 1 && entry->languageID >= 0x8000U )
        {
          if ( entry->languageID - 0x8000U >= table->numLangTagRecords    ||
               !table->langTags[entry->languageID - 0x8000U].stringLength )
          {
            /* invalid entry; ignore it */
            continue;
          }
        }

        /* mark the string as not yet converted */
        entry->string = NULL;

        valid++;
        entry++;
      }

      /* reduce array size to the actually used elements */
      FT_MEM_QRENEW_ARRAY( names,
                           table->numNameRecords,
                           valid );
      table->names          = names;
      names                 = NULL;
      table->numNameRecords = valid;
    }

    FT_FRAME_EXIT();

    /* everything went well, update face->num_names */
    face->num_names = (FT_UShort)table->numNameRecords;

  Exit:
    FT_FREE( names );
    FT_FREE( langTags );
    return error;
  }